

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GayBerneAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::GayBerneAdapter::makeGayBerne
          (GayBerneAdapter *this,RealType d,RealType l,RealType eps_X,RealType eps_S,RealType eps_E,
          RealType dw)

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_68 [32];
  RealType local_48;
  RealType local_40;
  RealType local_38;
  RealType local_30;
  RealType local_28;
  RealType local_20;
  
  bVar1 = isGayBerne(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)GBtypeID_abi_cxx11_);
  }
  this_00 = this->at_;
  local_48 = d;
  local_40 = l;
  local_38 = eps_X;
  local_30 = eps_S;
  local_28 = eps_E;
  local_20 = dw;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>,std::__cxx11::string_const&,OpenMD::GBAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (GBAtypeParameters *)GBtypeID_abi_cxx11_);
  local_68._16_8_ = local_68._0_8_;
  local_68._24_8_ = local_68._8_8_;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_68 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  return;
}

Assistant:

void GayBerneAdapter::makeGayBerne(RealType d, RealType l, RealType eps_X,
                                     RealType eps_S, RealType eps_E,
                                     RealType dw) {
    if (isGayBerne()) { at_->removeProperty(GBtypeID); }

    GBAtypeParameters gbParam {};
    gbParam.GB_d     = d;
    gbParam.GB_l     = l;
    gbParam.GB_eps_X = eps_X;
    gbParam.GB_eps_S = eps_S;
    gbParam.GB_eps_E = eps_E;
    gbParam.GB_dw    = dw;

    at_->addProperty(std::make_shared<GBAtypeData>(GBtypeID, gbParam));
  }